

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_5b0ff7::HandleRemoveImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool recurse,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  bool bVar2;
  undefined1 uVar3;
  string *psVar4;
  char *__s;
  undefined7 in_register_00000031;
  pointer args_00;
  string r;
  string fileName;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  string local_70;
  string local_50;
  
  args_00 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0xec;
  __s = "REMOVE";
  if ((int)CONCAT71(in_register_00000031,recurse) != 0) {
    __s = "REMOVE_RECURSE";
  }
  do {
    args_00 = args_00 + 1;
    if (args_00 == pbVar1) {
      return (bool)uVar3;
    }
    std::__cxx11::string::string((string *)&local_70,(string *)args_00);
    if (local_70._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,__s,(allocator<char> *)&local_d0);
      this = status->Makefile;
      std::operator+(&local_50,"Ignoring empty file name in ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                     &local_50,".");
      cmMakefile::IssueMessage(this,AUTHOR_WARNING,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      bVar2 = cmsys::SystemTools::FileIsFullPath(&local_70);
      if (!bVar2) {
        psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
        local_a0.View_._M_str = (psVar4->_M_dataplus)._M_p;
        local_a0.View_._M_len = psVar4->_M_string_length;
        local_d0.View_._M_len = 1;
        local_d0.View_._M_str = local_d0.Digits_;
        local_d0.Digits_[0] = '/';
        cmStrCat<std::__cxx11::string>(&local_50,&local_a0,&local_d0,args_00);
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      bVar2 = cmsys::SystemTools::FileIsDirectory(&local_70);
      if (bVar2) {
        bVar2 = cmsys::SystemTools::FileIsSymlink(&local_70);
        if (!bVar2 && recurse) {
          cmSystemTools::RepeatedRemoveDirectory(&local_70);
          goto LAB_0021bad0;
        }
      }
      cmsys::SystemTools::RemoveFile(&local_70);
    }
LAB_0021bad0:
    uVar3 = std::__cxx11::string::~string((string *)&local_70);
  } while( true );
}

Assistant:

bool HandleRemoveImpl(std::vector<std::string> const& args, bool recurse,
                      cmExecutionStatus& status)
{
  for (std::string const& arg :
       cmMakeRange(args).advance(1)) // Get rid of subcommand
  {
    std::string fileName = arg;
    if (fileName.empty()) {
      std::string const r = recurse ? "REMOVE_RECURSE" : "REMOVE";
      status.GetMakefile().IssueMessage(
        MessageType::AUTHOR_WARNING, "Ignoring empty file name in " + r + ".");
      continue;
    }
    if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
      fileName =
        cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', arg);
    }

    if (cmSystemTools::FileIsDirectory(fileName) &&
        !cmSystemTools::FileIsSymlink(fileName) && recurse) {
      cmSystemTools::RepeatedRemoveDirectory(fileName);
    } else {
      cmSystemTools::RemoveFile(fileName);
    }
  }
  return true;
}